

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move3.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  Moveable a;
  void *local_20;
  
  getTemp();
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Huge Mem from ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," @",2);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  operator_delete(local_20,4);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Moveable a(getTemp());
	std::cout << std::hex << "Huge Mem from " << __func__
			  << " @" << a.h.c << std::endl;
	return 0;
}